

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

bool console::readline_advanced(string *line,bool multiline_input)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  char32_t cVar5;
  int iVar6;
  reference pvVar7;
  value_type_conflict1 *__x;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  byte in_SIL;
  string *in_RDI;
  char last;
  bool has_more;
  int width;
  int offset;
  int i;
  int count;
  char32_t code;
  char32_t input_char;
  bool end_of_stream;
  bool is_special_char;
  vector<int,_std::allocator<int>_> widths;
  string *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  char32_t in_stack_ffffffffffffff84;
  string *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff9c;
  char32_t in_stack_ffffffffffffffa0;
  char32_t in_stack_ffffffffffffffa4;
  char32_t cVar11;
  undefined2 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffae;
  char cVar12;
  undefined1 in_stack_ffffffffffffffaf;
  int local_48;
  
  bVar3 = in_SIL & 1;
  if (out != _stdout) {
    fflush(_stdout);
  }
  std::__cxx11::string::clear();
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x33c9e1);
  bVar1 = false;
  bVar2 = false;
  while( true ) {
    fflush(out);
    cVar5 = getchar32();
    if ((cVar5 == L'\r') || (cVar5 == L'\n')) goto LAB_0033ccbe;
    if ((cVar5 == L'\xffffffff') || (cVar5 == L'\x04')) break;
    cVar11 = cVar5;
    if (bVar1) {
      set_display(in_stack_ffffffffffffff84);
      std::__cxx11::string::back();
      replace_last('\0');
      bVar1 = false;
    }
    if (cVar5 == L'\x1b') {
      in_stack_ffffffffffffffa4 = getchar32();
      if ((in_stack_ffffffffffffffa4 == L'[') || (in_stack_ffffffffffffffa4 == L'\x1b')) {
        do {
          in_stack_ffffffffffffffa0 = getchar32();
          if (((in_stack_ffffffffffffffa0 == L'\xffffffff') ||
              ((0x40 < (uint)in_stack_ffffffffffffffa0 && ((uint)in_stack_ffffffffffffffa0 < 0x5b)))
              ) || ((0x60 < (uint)in_stack_ffffffffffffffa0 &&
                    ((uint)in_stack_ffffffffffffffa0 < 0x7b)))) break;
        } while (in_stack_ffffffffffffffa0 != L'~');
      }
    }
    else if ((cVar5 == L'\b') || (cVar5 == L'\x7f')) {
      bVar4 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
      if (!bVar4) {
        do {
          pvVar7 = std::vector<int,_std::allocator<int>_>::back
                             ((vector<int,_std::allocator<int>_> *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          iVar6 = *pvVar7;
          std::vector<int,_std::allocator<int>_>::pop_back
                    ((vector<int,_std::allocator<int>_> *)0x33cb35);
          for (local_48 = 0; local_48 < iVar6; local_48 = local_48 + 1) {
            replace_last('\0');
            pop_cursor();
          }
          pop_back_utf8_char(in_stack_ffffffffffffff90);
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
          if (iVar6 == 0) {
            bVar4 = std::vector<int,_std::allocator<int>_>::empty
                              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
            in_stack_ffffffffffffff9c = CONCAT13(bVar4,(int3)in_stack_ffffffffffffff9c) ^ 0xff000000
            ;
          }
        } while ((in_stack_ffffffffffffff9c & 0x1000000) != 0);
      }
    }
    else {
      iVar6 = std::__cxx11::string::length();
      append_utf8(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
      lVar10 = std::__cxx11::string::c_str();
      __x = (value_type_conflict1 *)(lVar10 + iVar6);
      lVar10 = std::__cxx11::string::length();
      in_stack_ffffffffffffff90 = (string *)(lVar10 - iVar6);
      estimateWidth(L'\0');
      in_stack_ffffffffffffff84 =
           put_codepoint((char *)CONCAT17(in_stack_ffffffffffffffaf,
                                          CONCAT16(in_stack_ffffffffffffffae,
                                                   CONCAT24(in_stack_ffffffffffffffac,cVar11))),
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff9c);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,__x);
    }
    uVar8 = std::__cxx11::string::empty();
    if (((uVar8 & 1) == 0) &&
       ((pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 == '\\' ||
        (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 == '/')))) {
      set_display(in_stack_ffffffffffffff84);
      std::__cxx11::string::back();
      replace_last('\0');
      bVar1 = true;
    }
  }
  bVar2 = true;
LAB_0033ccbe:
  if (bVar1) {
    replace_last('\0');
    pop_cursor();
    pcVar9 = (char *)std::__cxx11::string::back();
    cVar12 = *pcVar9;
    std::__cxx11::string::pop_back();
    if (cVar12 == '\\') {
      std::__cxx11::string::operator+=(in_RDI,'\n');
      fputc(10,out);
      bVar3 = (bVar3 ^ 0xff) & 1;
    }
    else {
      lVar10 = std::__cxx11::string::length();
      if ((lVar10 == 1) && (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 == ' ')) {
        std::__cxx11::string::clear();
        pop_cursor();
      }
      bVar3 = 0;
    }
  }
  else if (bVar2) {
    bVar3 = 0;
  }
  else {
    std::__cxx11::string::operator+=(in_RDI,'\n');
    fputc(10,out);
  }
  fflush(out);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
  return (bool)(bVar3 & 1);
}

Assistant:

static bool readline_advanced(std::string & line, bool multiline_input) {
        if (out != stdout) {
            fflush(stdout);
        }

        line.clear();
        std::vector<int> widths;
        bool is_special_char = false;
        bool end_of_stream = false;

        char32_t input_char;
        while (true) {
            fflush(out); // Ensure all output is displayed before waiting for input
            input_char = getchar32();

            if (input_char == '\r' || input_char == '\n') {
                break;
            }

            if (input_char == (char32_t) WEOF || input_char == 0x04 /* Ctrl+D*/) {
                end_of_stream = true;
                break;
            }

            if (is_special_char) {
                set_display(user_input);
                replace_last(line.back());
                is_special_char = false;
            }

            if (input_char == '\033') { // Escape sequence
                char32_t code = getchar32();
                if (code == '[' || code == 0x1B) {
                    // Discard the rest of the escape sequence
                    while ((code = getchar32()) != (char32_t) WEOF) {
                        if ((code >= 'A' && code <= 'Z') || (code >= 'a' && code <= 'z') || code == '~') {
                            break;
                        }
                    }
                }
            } else if (input_char == 0x08 || input_char == 0x7F) { // Backspace
                if (!widths.empty()) {
                    int count;
                    do {
                        count = widths.back();
                        widths.pop_back();
                        // Move cursor back, print space, and move cursor back again
                        for (int i = 0; i < count; i++) {
                            replace_last(' ');
                            pop_cursor();
                        }
                        pop_back_utf8_char(line);
                    } while (count == 0 && !widths.empty());
                }
            } else {
                int offset = line.length();
                append_utf8(input_char, line);
                int width = put_codepoint(line.c_str() + offset, line.length() - offset, estimateWidth(input_char));
                if (width < 0) {
                    width = 0;
                }
                widths.push_back(width);
            }

            if (!line.empty() && (line.back() == '\\' || line.back() == '/')) {
                set_display(prompt);
                replace_last(line.back());
                is_special_char = true;
            }
        }

        bool has_more = multiline_input;
        if (is_special_char) {
            replace_last(' ');
            pop_cursor();

            char last = line.back();
            line.pop_back();
            if (last == '\\') {
                line += '\n';
                fputc('\n', out);
                has_more = !has_more;
            } else {
                // llama will just eat the single space, it won't act as a space
                if (line.length() == 1 && line.back() == ' ') {
                    line.clear();
                    pop_cursor();
                }
                has_more = false;
            }
        } else {
            if (end_of_stream) {
                has_more = false;
            } else {
                line += '\n';
                fputc('\n', out);
            }
        }

        fflush(out);
        return has_more;
    }